

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

FIOBJ fiobj_data_slice(FIOBJ parent,intptr_t offset,uintptr_t length)

{
  intptr_t iVar1;
  ulong uVar2;
  FIOBJ FVar3;
  FIOBJ FVar4;
  FIOBJ o;
  size_t parent_len;
  size_t parent_len_1;
  uintptr_t length_local;
  intptr_t offset_local;
  FIOBJ parent_local;
  
  length_local = offset;
  if (offset < 0) {
    iVar1 = fiobj_data_len(parent);
    length_local = iVar1 + 1 + offset;
  }
  offset_local = parent;
  if ((long)length_local < 0) {
    length_local = 0;
  }
  for (; *(int *)(offset_local + 0x30) == -2; offset_local = *(intptr_t *)(offset_local + 0x10)) {
    length_local = *(long *)(offset_local + 0x18) + length_local;
  }
  uVar2 = fiobj_data_len(offset_local);
  if (length_local < uVar2) {
    parent_len_1 = length;
    if (uVar2 < length_local + length) {
      parent_len_1 = uVar2 - length_local;
    }
  }
  else {
    parent_len_1 = 0;
    length_local = uVar2;
  }
  FVar3 = fiobj_data_alloc((void *)0x0,-2);
  *(uintptr_t *)(FVar3 + 0x18) = length_local;
  *(size_t *)(FVar3 + 0x20) = parent_len_1;
  FVar4 = fiobj_dup(offset_local);
  *(FIOBJ *)(FVar3 + 0x10) = FVar4;
  return FVar3;
}

Assistant:

FIOBJ fiobj_data_slice(FIOBJ parent, intptr_t offset, uintptr_t length) {
  /* cut from the end */
  if (offset < 0) {
    size_t parent_len = fiobj_data_len(parent);
    offset = parent_len + 1 + offset;
  }
  if (offset < 0)
    offset = 0;
  while (obj2io(parent)->fd == -2) {
    /* don't slice a slice... climb the parent chain. */
    offset += obj2io(parent)->capa;
    parent = obj2io(parent)->source.parent;
  }
  size_t parent_len = fiobj_data_len(parent);
  if (parent_len <= (size_t)offset) {
    length = 0;
    offset = parent_len;
  } else if (parent_len < offset + length) {
    length = parent_len - offset;
  }
  /* make the object */
  FIOBJ o = fiobj_data_alloc(NULL, -2);
  obj2io(o)->capa = offset;
  obj2io(o)->len = length;
  obj2io(o)->source.parent = fiobj_dup(parent);
  return o;
}